

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void populate_settings(Curl_easy *data,http_conn *httpc)

{
  uint uVar1;
  
  httpc->local_settings[0].settings_id = 3;
  uVar1 = Curl_multi_max_concurrent_streams(data->multi);
  httpc->local_settings[0].value = uVar1;
  httpc->local_settings[1].settings_id = 4;
  httpc->local_settings[1].value = 0x2000000;
  httpc->local_settings[2].settings_id = 2;
  httpc->local_settings[2].value = (uint)(data->multi->push_cb != (curl_push_callback)0x0);
  httpc->local_settings_num = 3;
  return;
}

Assistant:

static void populate_settings(struct Curl_easy *data,
                              struct http_conn *httpc)
{
  nghttp2_settings_entry *iv = httpc->local_settings;

  iv[0].settings_id = NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS;
  iv[0].value = Curl_multi_max_concurrent_streams(data->multi);

  iv[1].settings_id = NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE;
  iv[1].value = HTTP2_HUGE_WINDOW_SIZE;

  iv[2].settings_id = NGHTTP2_SETTINGS_ENABLE_PUSH;
  iv[2].value = data->multi->push_cb != NULL;

  httpc->local_settings_num = 3;
}